

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void __thiscall
ImGuiTextEditCallbackData::InsertChars
          (ImGuiTextEditCallbackData *this,int pos,char *new_text,char *new_text_end)

{
  int iVar1;
  size_t sVar2;
  int iVar3;
  
  if (new_text_end == (char *)0x0) {
    sVar2 = strlen(new_text);
    iVar3 = (int)sVar2;
  }
  else {
    iVar3 = (int)new_text_end - (int)new_text;
  }
  if (iVar3 + this->BufTextLen + 1 < this->BufSize) {
    iVar1 = this->BufTextLen - pos;
    if (iVar1 != 0) {
      memmove(this->Buf + pos + iVar3,this->Buf + pos,(long)iVar1);
    }
    memcpy(this->Buf + pos,new_text,(long)iVar3);
    this->Buf[(long)iVar3 + (long)this->BufTextLen] = '\0';
    iVar1 = this->CursorPos;
    if (pos <= iVar1) {
      iVar1 = iVar1 + iVar3;
      this->CursorPos = iVar1;
    }
    this->SelectionEnd = iVar1;
    this->SelectionStart = iVar1;
    this->BufDirty = true;
    this->BufTextLen = this->BufTextLen + iVar3;
  }
  return;
}

Assistant:

void ImGuiTextEditCallbackData::InsertChars(int pos, const char* new_text, const char* new_text_end)
{
    const int new_text_len = new_text_end ? (int)(new_text_end - new_text) : (int)strlen(new_text);
    if (new_text_len + BufTextLen + 1 >= BufSize)
        return;

    if (BufTextLen != pos)
        memmove(Buf + pos + new_text_len, Buf + pos, (size_t)(BufTextLen - pos));
    memcpy(Buf + pos, new_text, (size_t)new_text_len * sizeof(char));
    Buf[BufTextLen + new_text_len] = '\0';

    if (CursorPos >= pos)
        CursorPos += new_text_len;
    SelectionStart = SelectionEnd = CursorPos;
    BufDirty = true;
    BufTextLen += new_text_len;
}